

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void setReadOp(ReadOp *readOp,string *argument,bool *overrideFile,string *feature)

{
  bool bVar1;
  ReadOp RVar2;
  string operation;
  
  std::__cxx11::string::substr((ulong)&operation,(ulong)argument);
  bVar1 = std::operator==(&operation,"suf");
  if (bVar1) {
    RVar2 = BackupSuffix;
  }
  else {
    bVar1 = std::operator==(&operation,"pre");
    if (bVar1) {
      RVar2 = BackupPrefix;
    }
    else {
      bVar1 = std::operator==(&operation,"i");
      if (bVar1) {
        RVar2 = InputFiles;
      }
      else {
        bVar1 = std::operator==(&operation,"b");
        if (bVar1) {
          *overrideFile = false;
          RVar2 = Unspecified;
        }
        else {
          RVar2 = Unspecified;
          std::__cxx11::string::_M_assign((string *)feature);
        }
      }
    }
  }
  *readOp = RVar2;
  std::__cxx11::string::~string((string *)&operation);
  return;
}

Assistant:

void setReadOp(ReadOp &readOp, std::string &argument, bool &overrideFile, std::string &feature) {

    std::string operation = argument.substr(1, argument.size() - 1); // Remove the '-'

    if (operation == "suf") {
        readOp = BackupSuffix;
    } else if (operation == "pre") {
        readOp = BackupPrefix;
    } else if (operation == "i") {
        readOp = InputFiles;
    } else if (operation == "b") {
        overrideFile = false;
        readOp = Unspecified;
    } else {
        feature = operation;
        readOp = Unspecified;
    }
}